

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_custom_hsm.c
# Opt level: O0

int prov_custom_hsm_get_storage_root_key(HSM_CLIENT_HANDLE handle,uchar **key,size_t *key_len)

{
  uchar *puVar1;
  CUSTOM_HSM_SAMPLE_INFO *hsm_info;
  int result;
  size_t *key_len_local;
  uchar **key_local;
  HSM_CLIENT_HANDLE handle_local;
  
  if (((handle == (HSM_CLIENT_HANDLE)0x0) || (key == (uchar **)0x0)) || (key_len == (size_t *)0x0))
  {
    printf("Invalid handle value specified");
    hsm_info._4_4_ = 0xd6;
  }
  else {
    puVar1 = (uchar *)malloc(*(size_t *)((long)handle + 0x30));
    *key = puVar1;
    if (puVar1 == (uchar *)0x0) {
      printf("Failure allocating storage root key\r\n");
      hsm_info._4_4_ = 0xe0;
    }
    else {
      memcpy(*key,*(void **)((long)handle + 0x28),*(size_t *)((long)handle + 0x30));
      *key_len = *(size_t *)((long)handle + 0x30);
      hsm_info._4_4_ = 0;
    }
  }
  return hsm_info._4_4_;
}

Assistant:

int prov_custom_hsm_get_storage_root_key(HSM_CLIENT_HANDLE handle, unsigned char** key, size_t* key_len)
{
    int result;
    if (handle == NULL || key == NULL || key_len == NULL)
    {
        (void)printf("Invalid handle value specified");
        result = __LINE__;
    }
    else
    {
        // TODO: Retrieve the storage root key and malloc the value and return
        // it to the sdk
        CUSTOM_HSM_SAMPLE_INFO* hsm_info = (CUSTOM_HSM_SAMPLE_INFO*)handle;
        if ((*key = (unsigned char*)malloc(hsm_info->srk_len)) == NULL)
        {
            (void)printf("Failure allocating storage root key\r\n");
            result = __LINE__;
        }
        else
        {
            memcpy(*key, hsm_info->storage_root_key, hsm_info->srk_len);
            *key_len = hsm_info->srk_len;
            result = 0;
        }
    }
    return result;
}